

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O1

void __thiscall
Centaurus::ATNNode<unsigned_char>::print
          (ATNNode<unsigned_char> *this,wostream *os,int index,wstring *prefix)

{
  long *plVar1;
  wostream *pwVar2;
  long lVar3;
  wchar_t *pwVar4;
  
  switch(this->m_type) {
  case Blank:
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (os,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    pwVar4 = L" [ label=\"\", xlabel=\"[";
    lVar3 = 0x16;
    break;
  case Nonterminal:
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (os,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" [ label=\"",10);
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pwVar2,(this->m_invoke).m_id._M_dataplus._M_p,
                        (this->m_invoke).m_id._M_string_length);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L"\", xlabel=\"[",0xc);
    pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,index);
    pwVar2 = std::operator<<(pwVar2,"]\" ];");
    lVar3 = *(long *)pwVar2;
    goto LAB_0014f1d6;
  case LiteralTerminal:
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (os,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" [ label=\"\\\"\\\"",0xe);
    pwVar4 = L"\", xlabel=\"[";
    lVar3 = 0xc;
    break;
  case RegularTerminal:
    NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::print_subgraph
              (&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>,os,index,
               prefix);
    return;
  case WhiteSpace:
    pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (os,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    pwVar4 = L" [ label=\"[ ]\", xlabel=\"[";
    lVar3 = 0x19;
    break;
  default:
    return;
  }
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,pwVar4,lVar3);
  pwVar2 = (wostream *)std::wostream::operator<<((wostream *)pwVar2,index);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L"]\" ];",5);
  lVar3 = *(long *)pwVar2;
LAB_0014f1d6:
  plVar1 = *(long **)(pwVar2 + *(long *)(lVar3 + -0x18) + 0xf0);
  if (plVar1 == (long *)0x0) {
    std::__throw_bad_cast();
  }
  (**(code **)(*plVar1 + 0x50))(plVar1,10);
  std::wostream::put((wchar_t)pwVar2);
  std::wostream::flush();
  return;
}

Assistant:

void print(std::wostream& os, int index, const std::wstring& prefix) const
	{
		switch (m_type)
		{
		case ATNNodeType::Blank:
			os << prefix << L" [ label=\"\", xlabel=\"[" << index << L"]\" ];" << std::endl;
			break;
		case ATNNodeType::Nonterminal:
			os << prefix << L" [ label=\"" << m_invoke << L"\", xlabel=\"[" << index << "]\" ];" << std::endl;
			break;
		case ATNNodeType::LiteralTerminal:
			os << prefix << L" [ label=\"\\\"\\\"" << /*m_literal <<*/ L"\", xlabel=\"[" << index << L"]\" ];" << std::endl;
			break;
		case ATNNodeType::RegularTerminal:
			m_nfa.print_subgraph(os, index, prefix);
			break;
		case ATNNodeType::WhiteSpace:
			os << prefix << L" [ label=\"[ ]\", xlabel=\"[" << index << L"]\" ];" << std::endl;
			break;
		}
	}